

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::limits64<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  undefined8 this;
  bool bVar1;
  Lexer *this_00;
  unsigned_long *puVar2;
  optional<unsigned_long> oVar3;
  optional<unsigned_long> oVar4;
  optional<unsigned_long> m;
  allocator<char> local_69;
  string local_68;
  Err local_48;
  _Storage<unsigned_long,_true> local_28;
  optional<unsigned_long> n;
  ParseModuleTypesCtx *ctx_local;
  
  n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = ctx;
  oVar3 = Lexer::takeU64(&ctx->in);
  local_28._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_28);
  if (bVar1) {
    oVar3 = Lexer::takeU64((Lexer *)(n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                     super__Optional_payload_base<unsigned_long>._8_8_ + 8));
    this = n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._8_8_;
    puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_28);
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)
         (long)oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._0_9_;
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         (bool)(char)(oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._0_9_ >> 0x40);
    TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeLimits
              (__return_storage_ptr__,(TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx> *)this,
               *puVar2,oVar4);
  }
  else {
    this_00 = (Lexer *)(n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._8_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected initial size",&local_69);
    Lexer::err(&local_48,this_00,&local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_48);
    wasm::Err::~Err(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LimitsT> limits64(Ctx& ctx) {
  auto n = ctx.in.takeU64();
  if (!n) {
    return ctx.in.err("expected initial size");
  }
  std::optional<uint64_t> m = ctx.in.takeU64();
  return ctx.makeLimits(uint64_t(*n), m);
}